

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O2

bool __thiscall
MapLoader::validateBordersLine
          (MapLoader *this,vector<int,_std::allocator<int>_> *lineNums,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *lineWords,int *lineCount,bool *validMap,int *countryCount,bool verbose)

{
  pointer pbVar1;
  bool bVar2;
  ostream *poVar3;
  pointer pbVar4;
  int x;
  int *local_1c8;
  bool *local_1c0;
  stringstream parser;
  
  pbVar4 = (lineWords->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (lineWords->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)pbVar1 - (long)pbVar4) < 0x21) {
    if (verbose) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Line ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*lineCount);
      std::operator<<(poVar3,
                      " - [ERROR] : a line in the borders declaration had missing tokens, map could not be created.\n"
                     );
    }
    *validMap = false;
LAB_00113ae6:
    bVar2 = false;
  }
  else {
    local_1c8 = lineCount;
    local_1c0 = validMap;
    for (; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
      std::__cxx11::stringstream::stringstream
                ((stringstream *)&parser,(string *)pbVar4,_S_out|_S_in);
      x = 0;
      std::istream::operator>>((istream *)&parser,&x);
      std::vector<int,_std::allocator<int>_>::push_back(lineNums,&x);
      if (*countryCount < x) {
        if (verbose) {
          poVar3 = std::operator<<((ostream *)&std::cout,"Line ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,*local_1c8);
          std::operator<<(poVar3," - [ERROR] : a country or continent ID did was invalid.\n");
        }
        *local_1c0 = false;
        std::__cxx11::stringstream::~stringstream((stringstream *)&parser);
        goto LAB_00113ae6;
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&parser);
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool MapLoader::validateBordersLine(std::vector<int>* lineNums, std::vector<std::string>* lineWords, const int* lineCount,
                               bool* validMap, const int* countryCount, bool verbose) {
    //check validity of the line in this mode
    if (lineWords->size() < 2) {
        if(verbose){
            std::cout << "Line " << *lineCount
                      << " - [ERROR] : a line in the borders declaration had missing tokens, map could not be created.\n";
        }
        *validMap = false;
        return false;
    } else {
        //convert strings to ints
        for (auto& s : *lineWords) {
            std::stringstream parser(s);
            int x = 0;
            parser >> x;
            lineNums->push_back(x);
            //check that all countries referenced in this line exist
            if (x > *countryCount) {
                if(verbose){
                    std::cout << "Line " << *lineCount << " - [ERROR] : a country or continent ID did was invalid.\n";
                }
                *validMap = false;
                return false;
            }
        }
        return true;
    }
}